

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraKateGenerator.cxx
# Opt level: O1

void __thiscall
cmExtraKateGenerator::CreateKateProjectFile(cmExtraKateGenerator *this,cmMakefile *mf)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char *pcVar3;
  ostream *poVar4;
  size_t sVar5;
  string args;
  string filename;
  string make;
  cmGeneratedFileStream fout;
  allocator local_2f9;
  string local_2f8;
  string local_2d8;
  long *local_2b8 [2];
  long local_2a8 [2];
  long *local_298 [2];
  long local_288 [2];
  undefined1 local_278 [584];
  
  pcVar3 = cmMakefile::GetHomeOutputDirectory(mf);
  std::__cxx11::string::string((string *)local_2b8,pcVar3,(allocator *)local_278);
  std::__cxx11::string::append((char *)local_2b8);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_278,(char *)local_2b8[0],false);
  if (((byte)(*(_func_int **)(local_278._0_8_ + -0x18))[(long)(local_278 + 0x20)] & 5) == 0) {
    paVar1 = &local_2d8.field_2;
    local_2d8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"CMAKE_MAKE_PROGRAM","");
    pcVar3 = cmMakefile::GetRequiredDefinition(mf,&local_2d8);
    std::__cxx11::string::string((string *)local_298,pcVar3,(allocator *)&local_2f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    paVar2 = &local_2f8.field_2;
    local_2f8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2f8,"CMAKE_KATE_MAKE_ARGUMENTS","");
    pcVar3 = cmMakefile::GetSafeDefinition(mf,&local_2f8);
    std::__cxx11::string::string((string *)&local_2d8,pcVar3,&local_2f9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != paVar2) {
      operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"{\n\t\"name\": \"",0xc)
    ;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_278,(this->ProjectName)._M_dataplus._M_p,
                        (this->ProjectName)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\",\n\t\"directory\": \"",0x12);
    pcVar3 = cmMakefile::GetHomeDirectory(mf);
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)poVar4->_vptr_basic_ostream[-3]);
    }
    else {
      sVar5 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar3,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\",\n\t\"files\": [ { ",0x11);
    GenerateFilesString_abi_cxx11_(&local_2f8,this,mf);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_2f8._M_dataplus._M_p,local_2f8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"} ],\n",5);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != paVar2) {
      operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
    }
    WriteTargets(this,mf,(cmGeneratedFileStream *)local_278);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"}\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    if (local_298[0] != local_288) {
      operator_delete(local_298[0],local_288[0] + 1);
    }
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
  if (local_2b8[0] != local_2a8) {
    operator_delete(local_2b8[0],local_2a8[0] + 1);
  }
  return;
}

Assistant:

void cmExtraKateGenerator::CreateKateProjectFile(const cmMakefile* mf) const
{
  std::string filename = mf->GetHomeOutputDirectory();
  filename += "/.kateproject";
  cmGeneratedFileStream fout(filename.c_str());
  if (!fout)
    {
    return;
    }

  std::string make = mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM");
  std::string args = mf->GetSafeDefinition("CMAKE_KATE_MAKE_ARGUMENTS");

  fout <<
    "{\n"
    "\t\"name\": \"" << this->ProjectName << "\",\n"
    "\t\"directory\": \"" << mf->GetHomeDirectory() << "\",\n"
    "\t\"files\": [ { " << this->GenerateFilesString(mf) << "} ],\n";
  this->WriteTargets(mf, fout);
  fout << "}\n";
}